

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zvgPort.c
# Opt level: O0

uint zvgSetEcpMode(void)

{
  byte bVar1;
  uint uVar2;
  undefined4 local_c;
  uint err;
  
  if ((ZvgIO.ecpFlags & 1) == 0) {
    local_c = negotiate_1284('\x10');
    if (local_c == 0) {
      bVar1 = rdsr();
      if ((bVar1 & 0x10) == 0) {
        terminate_1284();
        local_c = 0x12;
      }
      else {
        ZvgIO.ecpFlags = ZvgIO.ecpFlags | 1;
        cdcr('\x02');
        uVar2 = waitForDsrEQ(0xf0,'p',1000);
        if (uVar2 == 0xffffffff) {
          compatibility();
          local_c = 0x12;
        }
        else {
          outb(true,(unsigned_short)ZvgIO.ecpEcr);
          sdcr('\x03');
          local_c = 0;
        }
      }
    }
  }
  else {
    local_c = 0;
  }
  return local_c;
}

Assistant:

uint zvgSetEcpMode( void)
{
	uint	err;

	if (ZvgIO.ecpFlags & ECPF_ECP)
		return (errOk);					// already in ECP mode

	// negotiate to ECP mode

	if ((err = (negotiate_1284( EMODE_ECP))) != errOk)
		return (err);

	// is ECP mode supported?

	if (!(rdsr() & DSR_XFlag))
	{	terminate_1284();					// exit negotiations
		return (errEcpFailed);			// if ECP mode not supported, return error
	}

	// Set the ECP mode flag

	ZvgIO.ecpFlags |= ECPF_ECP;

	// ECP setup phase

	cdcr( DCR_HostAck);					// indicate that XFlag read

	// wait for busy to go low

	if (waitForDsrEQ( DSR_nAckReverse|DSR_PeriphClk|DSR_PerphAck|DSR_XFlag,
			DSR_nAckReverse|DSR_PeriphClk|DSR_XFlag, PERIPH_WAIT) == ZVG_TIMEOUT)
	{	compatibility();					// if timeout, return to compatability mode
		return (errEcpFailed);			// could not get into ECP mode
	}

	// setup the hardware to do automatic ECP mode transfers

	outportb( ZvgIO.ecpEcr, ECR_ECP_mode | ECR_nErrIntrEn | ECR_serviceIntr);
	sdcr( DCR_HostAck | DCR_HostClk);
	return (errOk);
}